

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::RendererImpl<float>::doRenderAndConvert<short>
          (RendererImpl<float> *this,short *stereoStream,Bit32u len)

{
  float *pfVar1;
  short *psVar2;
  Bit32u len_00;
  float fVar3;
  float fVar4;
  float renderingBuffer [8192];
  float local_8038 [8194];
  
  if (len != 0) {
    do {
      len_00 = 0x1000;
      if (len < 0x1000) {
        len_00 = len;
      }
      doRender(this,local_8038,len_00);
      if (stereoStream != (short *)0x0) {
        pfVar1 = local_8038;
        psVar2 = stereoStream;
        do {
          fVar4 = -32768.0;
          if (-32768.0 <= *pfVar1 * 32768.0) {
            fVar4 = *pfVar1 * 32768.0;
          }
          fVar3 = 32767.0;
          if (fVar4 <= 32767.0) {
            fVar3 = fVar4;
          }
          pfVar1 = pfVar1 + 1;
          *psVar2 = (short)(int)fVar3;
          psVar2 = psVar2 + 1;
        } while (pfVar1 < local_8038 + len_00 * 2);
      }
      stereoStream = stereoStream + len_00 * 2;
      len = len - len_00;
    } while (len != 0);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvert(O *stereoStream, Bit32u len) {
	Sample renderingBuffer[MAX_SAMPLES_PER_RUN << 1];
	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRender(renderingBuffer, thisPassLen);
		convertSampleFormat(renderingBuffer, stereoStream, thisPassLen << 1);
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}